

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall
logUnits_negbase1000_Test::~logUnits_negbase1000_Test(logUnits_negbase1000_Test *this)

{
  logUnits_negbase1000_Test *this_local;
  
  ~logUnits_negbase1000_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(logUnits, negbase1000)
{
    EXPECT_EQ(convert(precise::kilo, precise::log::neglog1000), -1.0);
    EXPECT_EQ(convert(precise::milli, precise::log::neglog1000), 1.0);
    EXPECT_EQ(convert(precise::exa, precise::log::neglog1000), -6.0);
    EXPECT_EQ(convert(precise::femto, precise::log::neglog1000), 5.0);
    EXPECT_EQ(convert(-1.0, precise::log::neglog1000, precise::kilo), 1.0);
    EXPECT_EQ(convert(1.0, precise::log::neglog1000, precise::milli), 1.0);
    EXPECT_EQ(convert(-6.0, precise::log::neglog1000, precise::exa), 1.0);
    EXPECT_EQ(convert(5.0, precise::log::neglog1000, precise::femto), 1.0);
}